

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O1

double IF97::Backwards::Hsat_s(double s)

{
  int iVar1;
  out_of_range *this;
  Boundary2ab4HS *this_00;
  double dVar2;
  
  if (Hsat_s(double)::b14hs == '\0') {
    iVar1 = __cxa_guard_acquire(&Hsat_s(double)::b14hs);
    if (iVar1 != 0) {
      Boundary14HS::Boundary14HS(&Hsat_s::b14hs);
      __cxa_atexit(BackwardsRegion::~BackwardsRegion,&Hsat_s::b14hs,&__dso_handle);
      __cxa_guard_release(&Hsat_s(double)::b14hs);
    }
  }
  if (Hsat_s(double)::b3a4hs == '\0') {
    iVar1 = __cxa_guard_acquire(&Hsat_s(double)::b3a4hs);
    if (iVar1 != 0) {
      Boundary3a4HS::Boundary3a4HS(&Hsat_s::b3a4hs);
      __cxa_atexit(BackwardsRegion::~BackwardsRegion,&Hsat_s::b3a4hs,&__dso_handle);
      __cxa_guard_release(&Hsat_s(double)::b3a4hs);
    }
  }
  if (Hsat_s(double)::b2c3b4hs == '\0') {
    iVar1 = __cxa_guard_acquire(&Hsat_s(double)::b2c3b4hs);
    if (iVar1 != 0) {
      Boundary2c3b4HS::Boundary2c3b4HS(&Hsat_s::b2c3b4hs);
      __cxa_atexit(BackwardsRegion::~BackwardsRegion,&Hsat_s::b2c3b4hs,&__dso_handle);
      __cxa_guard_release(&Hsat_s(double)::b2c3b4hs);
    }
  }
  if (Hsat_s(double)::b2ab4hs == '\0') {
    iVar1 = __cxa_guard_acquire(&Hsat_s(double)::b2ab4hs);
    if (iVar1 != 0) {
      Boundary2ab4HS::Boundary2ab4HS(&Hsat_s::b2ab4hs);
      __cxa_atexit(BackwardsRegion::~BackwardsRegion,&Hsat_s::b2ab4hs,&__dso_handle);
      __cxa_guard_release(&Hsat_s(double)::b2ab4hs);
    }
  }
  if (0.0 <= s) {
    if (s <= 3.77828134) {
      this_00 = (Boundary2ab4HS *)&Hsat_s::b14hs;
    }
    else if (s <= 4.41202148223476) {
      this_00 = (Boundary2ab4HS *)&Hsat_s::b3a4hs;
    }
    else if (s <= 5.85) {
      this_00 = (Boundary2ab4HS *)&Hsat_s::b2c3b4hs;
    }
    else {
      if (9.155492076509681 < s) {
        this = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this,"Entropy out of range");
        goto LAB_0011b378;
      }
      this_00 = &Hsat_s::b2ab4hs;
    }
    dVar2 = BackwardsRegion::h_s(&this_00->super_BackwardsRegion,s);
    return dVar2;
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"Entropy out of range");
LAB_0011b378:
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

inline double Hsat_s(double s){
            // Only called for Region determination and debugging.  Has range checking.
            static Boundary14HS b14hs;
            static Boundary3a4HS b3a4hs;
            static Boundary2c3b4HS b2c3b4hs;
            static Boundary2ab4HS b2ab4hs;
            if (s < 0)
                throw std::out_of_range("Entropy out of range");
            else if (s <= SfT23 )
                return b14hs.h_s(s);
            else if (s <= Scrit)
                return b3a4hs.h_s(s);
            else if (s <= S2bc)
                return b2c3b4hs.h_s(s);
            else if (s <= Sgtrip)
                return b2ab4hs.h_s(s);
            else
                throw std::out_of_range("Entropy out of range");
        }